

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.h
# Opt level: O2

char * __thiscall json::Value::parse(Value *this,char *curr,StringEncoding stringEncoding)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  Value *pVVar5;
  __shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *this_01;
  string *psVar6;
  byte *pbVar7;
  byte *curr_00;
  double n;
  string local_180 [32];
  string local_160 [32];
  string local_140 [32];
  string local_120 [32];
  string local_100 [32];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  undefined1 local_60 [8];
  Ref value;
  IString key;
  
  while( true ) {
    bVar1 = *curr;
    uVar4 = (ulong)bVar1;
    if (0x22 < uVar4) break;
    if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
      if (uVar4 == 0x22) {
        pbVar7 = (byte *)curr + 1;
        curr = (char *)pbVar7;
        goto LAB_001a1f96;
      }
      break;
    }
    curr = (char *)((byte *)curr + 1);
  }
  if (bVar1 == 0x5b) {
    do {
      curr = (char *)((byte *)curr + 1);
      if (0x20 < (ulong)(byte)*curr) break;
    } while ((0x100002600U >> ((ulong)(byte)*curr & 0x3f) & 1) != 0);
    setArray(this,0);
    this_00 = &value.super_shared_ptr<json::Value>.
               super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_001a2211:
    if (*curr != 0x5d) {
      pVVar5 = (Value *)operator_new(0x18);
      pVVar5->type = Null;
      (pVVar5->field_1).str.str._M_len = 0;
      std::__shared_ptr<json::Value,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<json::Value,void>
                ((__shared_ptr<json::Value,(__gnu_cxx::_Lock_policy)2> *)this_00,pVVar5);
      std::vector<json::Value::Ref,_std::allocator<json::Value::Ref>_>::push_back
                ((this->field_1).arr,(value_type *)this_00);
      curr = parse((Value *)value.super_shared_ptr<json::Value>.
                            super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                            _M_pi,curr,stringEncoding);
      pbVar7 = (byte *)curr;
      while( true ) {
        pbVar7 = pbVar7 + 1;
        uVar4 = (ulong)(byte)*curr;
        if (0x2c < uVar4) break;
        if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
          if (uVar4 == 0x2c) goto LAB_001a2278;
          break;
        }
        curr = (char *)((byte *)curr + 1);
      }
      if (*curr != 0x5d) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_160,"malformed JSON array",(allocator<char> *)local_60);
        std::__cxx11::string::string(psVar6,local_160);
        __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      bVar2 = false;
      goto LAB_001a22a1;
    }
    goto LAB_001a233f;
  }
  if (bVar1 == 0x66) {
    iVar3 = strncmp(curr,"false",5);
    if (iVar3 == 0) {
      setBool(this,false);
      return (char *)((byte *)curr + 5);
    }
    psVar6 = (string *)__cxa_allocate_exception(0x20);
    std::__cxx11::string::string<std::allocator<char>>
              (local_100,"unexpected JSON literal",
               (allocator<char> *)
               &value.super_shared_ptr<json::Value>.
                super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__cxx11::string::string(psVar6,local_100);
    __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
  }
  if (bVar1 == 0x6e) {
    iVar3 = strncmp(curr,"null",4);
    if (iVar3 != 0) {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (local_140,"unexpected JSON literal",
                 (allocator<char> *)
                 &value.super_shared_ptr<json::Value>.
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::string(psVar6,local_140);
      __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    setNull(this);
  }
  else {
    if (bVar1 != 0x74) {
      if (bVar1 != 0x7b) {
        n = strtod(curr,(char **)&value.super_shared_ptr<json::Value>.
                                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_refcount);
        setNumber(this,n);
        return (char *)value.super_shared_ptr<json::Value>.
                       super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        ;
      }
      do {
        curr = (char *)((byte *)curr + 1);
        if (0x20 < (ulong)(byte)*curr) break;
      } while ((0x100002600U >> ((ulong)(byte)*curr & 0x3f) & 1) != 0);
      setObject(this);
LAB_001a20ba:
      if (*curr == 0x22) {
        pbVar7 = (byte *)strchr((char *)((byte *)curr + 1),0x22);
        if (pbVar7 == (byte *)0x0) {
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_c0,"malformed key in JSON object",
                     (allocator<char> *)
                     &value.super_shared_ptr<json::Value>.
                      super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__cxx11::string::string(psVar6,local_c0);
          __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
        }
        *pbVar7 = 0;
        ::wasm::IString::IString
                  ((IString *)
                   &value.super_shared_ptr<json::Value>.
                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   (char *)((byte *)curr + 1));
        curr_00 = pbVar7 + 2;
        while( true ) {
          pbVar7 = pbVar7 + 1;
          uVar4 = (ulong)*pbVar7;
          if (0x3a < uVar4) goto LAB_001a2357;
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) break;
          curr_00 = curr_00 + 1;
        }
        if (uVar4 != 0x3a) {
LAB_001a2357:
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_a0,"missing \':\', in JSON object",(allocator<char> *)local_60);
          std::__cxx11::string::string(psVar6,local_a0);
          __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
        }
        while (((ulong)*curr_00 < 0x21 && ((0x100002600U >> ((ulong)*curr_00 & 0x3f) & 1) != 0))) {
          curr_00 = curr_00 + 1;
        }
        pVVar5 = (Value *)operator_new(0x18);
        pVVar5->type = Null;
        (pVVar5->field_1).str.str._M_len = 0;
        std::__shared_ptr<json::Value,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<json::Value,void>
                  ((__shared_ptr<json::Value,(__gnu_cxx::_Lock_policy)2> *)local_60,pVVar5);
        curr = parse((Value *)local_60,(char *)curr_00,stringEncoding);
        this_01 = (__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)
                  std::__detail::
                  _Map_base<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<wasm::IString,_std::pair<const_wasm::IString,_json::Value::Ref>,_std::allocator<std::pair<const_wasm::IString,_json::Value::Ref>_>,_std::__detail::_Select1st,_std::equal_to<wasm::IString>,_std::hash<wasm::IString>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)(this->field_1).arr,
                               (key_type *)
                               &value.super_shared_ptr<json::Value>.
                                super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount);
        std::__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (this_01,(__shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2> *)local_60);
        pbVar7 = (byte *)curr;
        while( true ) {
          pbVar7 = pbVar7 + 1;
          uVar4 = (ulong)(byte)*curr;
          if (0x2c < uVar4) break;
          if ((0x100002600U >> (uVar4 & 0x3f) & 1) == 0) {
            if (uVar4 == 0x2c) goto LAB_001a21a4;
            break;
          }
          curr = (char *)((byte *)curr + 1);
        }
        if (*curr != 0x7d) {
          psVar6 = (string *)__cxa_allocate_exception(0x20);
          std::__cxx11::string::string<std::allocator<char>>
                    (local_80,"malformed value in JSON object",
                     (allocator<char> *)((long)&key.str._M_str + 7));
          std::__cxx11::string::string(psVar6,local_80);
          __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
        }
        bVar2 = false;
        goto LAB_001a21cd;
      }
      if (*curr != 0x7d) {
        psVar6 = (string *)__cxa_allocate_exception(0x20);
        std::__cxx11::string::string<std::allocator<char>>
                  (local_e0,"malformed key in JSON object",
                   (allocator<char> *)
                   &value.super_shared_ptr<json::Value>.
                    super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__cxx11::string::string(psVar6,local_e0);
        __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
      }
      goto LAB_001a233f;
    }
    iVar3 = strncmp(curr,"true",4);
    if (iVar3 != 0) {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (local_120,"unexpected JSON literal",
                 (allocator<char> *)
                 &value.super_shared_ptr<json::Value>.
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::string(psVar6,local_120);
      __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    setBool(this,true);
  }
  return (char *)((byte *)curr + 4);
LAB_001a1f96:
  bVar1 = *curr;
  if (bVar1 == 0x5c) {
    if (((byte *)curr)[1] == 0) {
      psVar6 = (string *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string<std::allocator<char>>
                (local_180,"unexpected end of JSON string (quoting)",
                 (allocator<char> *)
                 &value.super_shared_ptr<json::Value>.
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::__cxx11::string::string(psVar6,local_180);
      __cxa_throw(psVar6,&JsonParseException::typeinfo,JsonParseException::~JsonParseException);
    }
    curr = (char *)((byte *)curr + 1);
  }
  else if ((bVar1 == 0) || (bVar1 == 0x22)) goto LAB_001a22bb;
  curr = (char *)((byte *)curr + 1);
  goto LAB_001a1f96;
LAB_001a2278:
  while (((ulong)*pbVar7 < 0x21 && ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
  }
  bVar2 = true;
  curr = (char *)pbVar7;
LAB_001a22a1:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&key);
  if (!bVar2) goto LAB_001a233f;
  goto LAB_001a2211;
LAB_001a21a4:
  while (((ulong)*pbVar7 < 0x21 && ((0x100002600U >> ((ulong)*pbVar7 & 0x3f) & 1) != 0))) {
    pbVar7 = pbVar7 + 1;
  }
  bVar2 = true;
  curr = (char *)pbVar7;
LAB_001a21cd:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&value);
  if (!bVar2) goto LAB_001a233f;
  goto LAB_001a20ba;
LAB_001a22bb:
  *curr = 0;
  if (stringEncoding == WTF16) {
    unescapeIntoWTF16(this,(char *)pbVar7);
  }
  else {
    if (stringEncoding != ASCII) {
      __assert_fail("stringEncoding == WTF16",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                    ,0x131,"char *json::Value::parse(char *, StringEncoding)");
    }
    setString(this,(char *)pbVar7);
  }
LAB_001a233f:
  return (char *)((byte *)curr + 1);
}

Assistant:

char* parse(char* curr, StringEncoding stringEncoding) {
#define is_json_space(x)                                                       \
  (x == 32 || x == 9 || x == 10 ||                                             \
   x == 13) /* space, tab, linefeed/newline, or return */
#define skip()                                                                 \
  {                                                                            \
    while (*curr && is_json_space(*curr))                                      \
      curr++;                                                                  \
  }
    skip();
    if (*curr == '"') {
      // String
      // Start |close| after the opening ", and in the loop below we will always
      // begin looking at the first character after.
      char* close = curr + 1;
      // Skip escaped ", which appears as \". We need to be careful though, as
      // \" might also be \\" which would be an escaped \ and an *un*escaped ".
      while (*close && *close != '"') {
        if (*close == '\\') {
          // Skip the \ and the character after it, which it escapes.
          close++;
          THROW_IF(!*close, "unexpected end of JSON string (quoting)");
        }
        close++;
      }
      THROW_IF(!close, "unexpected end of JSON string");
      *close = 0; // end this string, and reuse it straight from the input
      char* raw = curr + 1;
      if (stringEncoding == ASCII) {
        // Just use the current string.
        setString(raw);
      } else {
        assert(stringEncoding == WTF16);
        unescapeIntoWTF16(raw);
      }
      curr = close + 1;
    } else if (*curr == '[') {
      // Array
      curr++;
      skip();
      setArray();
      while (*curr != ']') {
        Ref temp = Ref(new Value());
        arr->push_back(temp);
        curr = temp->parse(curr, stringEncoding);
        skip();
        if (*curr == ']') {
          break;
        }
        THROW_IF(*curr != ',', "malformed JSON array");
        curr++;
        skip();
      }
      curr++;
    } else if (*curr == 'n') {
      // Null
      THROW_IF(strncmp(curr, "null", 4) != 0, "unexpected JSON literal");
      setNull();
      curr += 4;
    } else if (*curr == 't') {
      // Bool true
      THROW_IF(strncmp(curr, "true", 4) != 0, "unexpected JSON literal");
      setBool(true);
      curr += 4;
    } else if (*curr == 'f') {
      // Bool false
      THROW_IF(strncmp(curr, "false", 5) != 0, "unexpected JSON literal");
      setBool(false);
      curr += 5;
    } else if (*curr == '{') {
      // Object
      curr++;
      skip();
      setObject();
      while (*curr != '}') {
        THROW_IF(*curr != '"', "malformed key in JSON object");
        curr++;
        char* close = strchr(curr, '"');
        THROW_IF(!close, "malformed key in JSON object");
        *close = 0; // end this string, and reuse it straight from the input
        IString key(curr);
        curr = close + 1;
        skip();
        THROW_IF(*curr != ':', "missing ':', in JSON object");
        curr++;
        skip();
        Ref value = Ref(new Value());
        curr = value->parse(curr, stringEncoding);
        (*obj)[key] = value;
        skip();
        if (*curr == '}') {
          break;
        }
        THROW_IF(*curr != ',', "malformed value in JSON object");
        curr++;
        skip();
      }
      curr++;
    } else {
      // Number
      char* after;
      setNumber(strtod(curr, &after));
      curr = after;
    }
    return curr;
  }